

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

StructDef * __thiscall flatbuffers::EnumDef::ReverseLookup(EnumDef *this,int enum_idx)

{
  bool bVar1;
  reference ppEVar2;
  __normal_iterator<flatbuffers::EnumVal_**,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_38;
  __normal_iterator<flatbuffers::EnumVal_**,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_30;
  __normal_iterator<flatbuffers::EnumVal_**,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  local_28;
  __normal_iterator<flatbuffers::EnumVal_**,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
  it;
  int enum_idx_local;
  EnumDef *this_local;
  
  it._M_current._4_4_ = enum_idx;
  if ((this->is_union & 1U) == 0) {
    __assert_fail("is_union",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlexStocks[P]flatbuffers/include/flatbuffers/idl.h"
                  ,0xe0,"StructDef *flatbuffers::EnumDef::ReverseLookup(int)");
  }
  local_30._M_current =
       (EnumVal **)
       std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::begin
                 (&(this->vals).vec);
  local_28 = __gnu_cxx::
             __normal_iterator<flatbuffers::EnumVal_**,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
             ::operator+(&local_30,1);
  while( true ) {
    local_38._M_current =
         (EnumVal **)
         std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>::end
                   (&(this->vals).vec);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
    if (!bVar1) {
      return (StructDef *)0x0;
    }
    ppEVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumVal_**,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
              ::operator*(&local_28);
    if ((*ppEVar2)->value == it._M_current._4_4_) break;
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumVal_**,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
    ::operator++(&local_28);
  }
  ppEVar2 = __gnu_cxx::
            __normal_iterator<flatbuffers::EnumVal_**,_std::vector<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>_>
            ::operator*(&local_28);
  return (*ppEVar2)->struct_def;
}

Assistant:

StructDef *ReverseLookup(int enum_idx) {
    assert(is_union);
    for (auto it = vals.vec.begin() + 1; it != vals.vec.end(); ++it) {
      if ((*it)->value == enum_idx) {
        return (*it)->struct_def;
      }
    }
    return nullptr;
  }